

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

int __thiscall roaring::Roaring64Map::remove(Roaring64Map *this,char *__filename)

{
  iterator iter_00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar4;
  int extraout_EAX;
  iterator this_00;
  undefined7 extraout_var;
  pointer ppVar5;
  Roaring *bitmap;
  iterator iter;
  map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  *in_stack_ffffffffffffffb8;
  Roaring *this_01;
  undefined4 in_stack_ffffffffffffffe0;
  _Self local_18;
  char *local_10;
  Roaring64Map *local_8;
  int iVar3;
  
  local_10 = __filename;
  local_8 = this;
  uVar2 = highBytes((uint64_t)__filename);
  local_18._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
       ::find(in_stack_ffffffffffffffb8,(key_type *)0x10c8c5);
  this_00 = std::
            map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
            ::end(in_stack_ffffffffffffffb8);
  bVar1 = std::operator==(&local_18,(_Self *)&stack0xffffffffffffffd8);
  iVar3 = (int)CONCAT71(extraout_var,bVar1);
  if (!bVar1) {
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                        0x10c8fa);
    this_01 = &ppVar5->second;
    uVar4 = lowBytes((uint64_t)local_10);
    Roaring::remove(this_01,(char *)(ulong)uVar4);
    iter_00._M_node._4_4_ = uVar2;
    iter_00._M_node._0_4_ = in_stack_ffffffffffffffe0;
    eraseIfEmpty((Roaring64Map *)this_00._M_node,iter_00);
    iVar3 = extraout_EAX;
  }
  return iVar3;
}

Assistant:

void remove(uint64_t x) {
        auto iter = roarings.find(highBytes(x));
        if (iter == roarings.end()) {
            return;
        }
        auto &bitmap = iter->second;
        bitmap.remove(lowBytes(x));
        eraseIfEmpty(iter);
    }